

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicates
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,
          nodeset_eval_t eval)

{
  bool bVar1;
  type_t type;
  size_t sVar2;
  bool local_41;
  xpath_ast_node *local_38;
  xpath_ast_node *pred;
  bool last_once;
  nodeset_eval_t eval_local;
  xpath_stack *stack_local;
  size_t first_local;
  xpath_node_set_raw *ns_local;
  xpath_ast_node *this_local;
  
  sVar2 = xpath_node_set_raw::size(ns);
  if (sVar2 != first) {
    type = xpath_node_set_raw::type(ns);
    bVar1 = eval_once(type,eval);
    for (local_38 = this->_right; local_38 != (xpath_ast_node *)0x0; local_38 = local_38->_next) {
      local_41 = false;
      if (local_38->_next == (xpath_ast_node *)0x0) {
        local_41 = bVar1;
      }
      apply_predicate(local_38,ns,first,stack,local_41);
    }
  }
  return;
}

Assistant:

void apply_predicates(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, nodeset_eval_t eval)
		{
			if (ns.size() == first) return;

			bool last_once = eval_once(ns.type(), eval);

			for (xpath_ast_node* pred = _right; pred; pred = pred->_next)
				pred->apply_predicate(ns, first, stack, !pred->_next && last_once);
		}